

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_crypt.c
# Opt level: O0

int ulp_ring_decrypt(ulp_ring_ciphertext *ciphertext,ulp_ring_private_key *priv_key,uint8_t **msg_p)

{
  int iVar1;
  ulong __size;
  uint64_t *result;
  uint8_t *out;
  undefined8 *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  size_t i;
  uint8_t *msg;
  uint64_t *tmp;
  size_t num_bytes;
  ulong local_40;
  int local_4;
  
  if ((in_RDI == (ulong *)0x0) || (in_RSI == (ulong *)0x0)) {
    local_4 = -1;
  }
  else if (*in_RDI == *in_RSI) {
    __size = *in_RSI >> 3;
    if (__size << 3 != *in_RSI) {
      __size = __size + 1;
    }
    result = (uint64_t *)malloc(*in_RSI << 3);
    out = (uint8_t *)malloc(__size);
    if (((result == (uint64_t *)0x0) || (out == (uint8_t *)0x0)) ||
       (iVar1 = poly_mulmod(in_RDI,in_RSI,(size_t)in_RDX,__size,result), iVar1 != 0)) {
      free(result);
      free(out);
      local_4 = -1;
    }
    else {
      for (local_40 = 0; local_40 < *in_RSI; local_40 = local_40 + 1) {
        result[local_40] = (result[local_40] + *(long *)(in_RDI[2] + local_40 * 8)) % in_RSI[1];
      }
      decode(result,out,*in_RSI,in_RSI[1]);
      free(result);
      *in_RDX = out;
      local_4 = 0;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int ulp_ring_decrypt(ulp_ring_ciphertext* ciphertext, ulp_ring_private_key* priv_key, uint8_t** msg_p) {

    if(ciphertext == NULL || priv_key == NULL)
        return -1;

    if(ciphertext->n != priv_key->n)
        return -2;

    // compute number of bytes needed for storing the decrypted plaintext
    size_t num_bytes = priv_key->n / 8;
    if(num_bytes * 8 != priv_key->n)
        num_bytes++;

    // allocate memory
    uint64_t* tmp = malloc(priv_key->n * sizeof(priv_key->q));
    uint8_t* msg = malloc(num_bytes);
    if(tmp == NULL || msg == NULL)
        goto fail;

    // s * c1 + c2
    if(poly_mulmod(priv_key->s, ciphertext->c1, priv_key->n, priv_key->q, tmp) != 0)
        goto fail;
    for(size_t i = 0; i < priv_key->n; i++) {
        tmp[i] = (tmp[i] + ciphertext->c2[i]) % priv_key->q;
    }

    // decode decrypted message
    decode(tmp, msg, priv_key->n, priv_key->q);

    // exit properly
    free(tmp);
    *msg_p = msg;
    return 0;


    fail:
        free(tmp);
        free(msg);
        return -1;

}